

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Message.cpp
# Opt level: O0

void __thiscall
FIX::Message::Message(Message *this,string *string,DataDictionary *dataDictionary,bool validate)

{
  message_order local_48;
  byte local_21;
  DataDictionary *pDStack_20;
  bool validate_local;
  DataDictionary *dataDictionary_local;
  string *string_local;
  Message *this_local;
  
  local_21 = validate;
  pDStack_20 = dataDictionary;
  dataDictionary_local = (DataDictionary *)string;
  string_local = (string *)this;
  message_order::message_order(&local_48,normal);
  FieldMap::FieldMap(&this->super_FieldMap,&local_48);
  message_order::~message_order(&local_48);
  (this->super_FieldMap)._vptr_FieldMap = (_func_int **)&PTR__Message_00330260;
  Header::Header(&this->m_header);
  Trailer::Trailer(&this->m_trailer);
  this->m_validStructure = true;
  this->m_tag = 0;
  setString(this,(string *)dataDictionary_local,(bool)(local_21 & 1),pDStack_20,pDStack_20);
  return;
}

Assistant:

EXCEPT(InvalidMessage)
    : m_validStructure(true),
      m_tag(0) {
  setString(string, validate, &dataDictionary, &dataDictionary);
}